

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

uint32_t __thiscall
asmjit::RALocalAllocator::decideOnReassignment
          (RALocalAllocator *this,uint32_t group,uint32_t workId,uint32_t physId,
          uint32_t allocableRegs)

{
  uint32_t **ppuVar1;
  uint32_t **ppuVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  WorkToPhysMap *pWVar6;
  BaseCompiler *pBVar7;
  PhysToWorkMap *pPVar8;
  PhysToWorkMap *pPVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  Error EVar12;
  uint uVar13;
  ulong uVar14;
  uint32_t *puVar15;
  Operand_ *pOVar16;
  long lVar17;
  uint32_t uVar18;
  ulong uVar19;
  RABlock *block;
  BaseRAPass *unaff_RBX;
  RALocalAllocator *pRVar20;
  uint uVar21;
  ulong unaff_RBP;
  undefined4 in_register_00000034;
  BaseNode *pBVar22;
  InstNode *node;
  RALocalAllocator *this_00;
  undefined4 in_register_00000084;
  uint *puVar23;
  ulong uVar24;
  uint uVar25;
  ulong unaff_R12;
  BaseNode *unaff_R13;
  uint uVar26;
  ulong unaff_R14;
  uint uVar27;
  uint uVar28;
  ulong unaff_R15;
  bool bVar29;
  uint32_t uStack_f0;
  uint32_t uStack_ec;
  uint32_t uStack_e8;
  uint32_t uStack_e4;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  RALocalAllocator *pRStack_c8;
  ulong uStack_c0;
  BaseNode *pBStack_b8;
  RALocalAllocator *pRStack_b0;
  ulong uStack_a8;
  uint32_t *puStack_a0;
  Error EStack_94;
  RAAssignment *pRStack_90;
  RALocalAllocator *pRStack_88;
  InstNode *pIStack_80;
  BaseNode *pBStack_78;
  BaseRAPass *pBStack_70;
  ulong uStack_68;
  BaseNode *pBStack_60;
  ulong uStack_58;
  ulong uStack_50;
  ulong uStack_48;
  
  puVar23 = (uint *)CONCAT44(in_register_00000084,allocableRegs);
  pBVar22 = (BaseNode *)CONCAT44(in_register_00000034,group);
  if (allocableRegs == 0) {
    decideOnReassignment();
  }
  else if (workId < (this->_pass->_workRegs).super_ZoneVectorBase._size) {
    bVar3 = *(byte *)(*(long *)((long)(this->_pass->_workRegs).super_ZoneVectorBase._data +
                               (ulong)workId * 8) + 0x3a);
    uVar18 = (uint32_t)bVar3;
    if ((1 << (bVar3 & 0x1f) & allocableRegs) == 0) {
      uVar18 = 0xff;
    }
    if (bVar3 == 0xff) {
      uVar18 = 0xff;
    }
    return uVar18;
  }
  decideOnReassignment();
  if (physId == 0) {
LAB_0011e328:
    uStack_48 = 0x11e32d;
    decideOnSpillFor();
  }
  else {
    uVar13 = 0;
    if (physId != 0) {
      for (; (physId >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
      }
    }
    uVar14 = (ulong)uVar13;
    uVar21 = 1 << ((byte)uVar13 & 0x1f);
    unaff_RBP = (ulong)uVar21;
    uVar19 = (ulong)pBVar22 & 0xffffffff;
    puVar15 = (this->_curAssignment)._physToWorkIds[uVar19];
    uVar28 = puVar15[uVar14];
    uVar24 = (ulong)uVar28;
    if (uVar21 == physId) {
LAB_0011e311:
      *puVar23 = uVar28;
      return uVar13;
    }
    unaff_RBX = this->_pass;
    uVar4 = (unaff_RBX->_workRegs).super_ZoneVectorBase._size;
    if (uVar28 < uVar4) {
      if ((uint)pBVar22 < 4) {
        pBVar22 = (BaseNode *)(unaff_RBX->_workRegs).super_ZoneVectorBase._data;
        uVar26 = (uint)(*(float *)((long)&(pBVar22->field_0)._links[uVar24][1]._passData + 4) *
                       1048576.0);
        uVar5 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks[uVar19];
        this = (RALocalAllocator *)(ulong)uVar5;
        uVar28 = uVar26 + 0x40000;
        if ((uVar5 & uVar21) == 0) {
          uVar28 = uVar26;
        }
        unaff_RBX = (BaseRAPass *)(ulong)uVar28;
        uVar21 = physId ^ 1 << (uVar13 & 0x1f);
        do {
          uVar13 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          uVar28 = puVar15[uVar13];
          unaff_R14 = (ulong)uVar28;
          if (uVar4 <= uVar28) {
            uStack_48 = 0x11e328;
            decideOnSpillFor();
            goto LAB_0011e328;
          }
          uVar26 = 1 << ((byte)uVar13 & 0x1f);
          unaff_RBP = (ulong)uVar26;
          uVar27 = uVar21 ^ 1 << (uVar13 & 0x1f);
          unaff_R15 = (ulong)uVar27;
          uVar25 = (uint)(*(float *)((long)&(pBVar22->field_0)._links[unaff_R14][1]._passData + 4) *
                         1048576.0);
          unaff_R12 = (ulong)uVar25;
          uVar28 = uVar25 + 0x40000;
          if ((uVar5 >> (uVar13 & 0x1f) & 1) == 0) {
            uVar28 = uVar25;
          }
          unaff_R13 = (BaseNode *)(ulong)uVar28;
          bVar29 = uVar28 < (uint)unaff_RBX;
          if (bVar29) {
            unaff_RBX = (BaseRAPass *)(ulong)uVar28;
            uVar24 = unaff_R14;
          }
          uVar28 = (uint)uVar24;
          if (bVar29) {
            uVar14 = (ulong)uVar13;
          }
          uVar13 = (uint)uVar14;
          bVar29 = uVar26 != uVar21;
          uVar21 = uVar27;
        } while (bVar29);
        goto LAB_0011e311;
      }
      goto LAB_0011e332;
    }
  }
  uStack_48 = 0x11e332;
  decideOnSpillFor();
LAB_0011e332:
  uStack_48 = 0x11e337;
  decideOnSpillFor();
  node = (InstNode *)pBVar22->_passData;
  this_00 = (RALocalAllocator *)(ulong)*(uint *)((long)&(node->super_BaseNode).field_0 + 0xc);
  if (this_00 != (RALocalAllocator *)0x0) {
    pRStack_90 = &this->_curAssignment;
    puVar15 = node->_opArray[0]._data + 1;
    pRVar20 = (RALocalAllocator *)0x0;
    pRStack_88 = this_00;
    pIStack_80 = node;
    pBStack_78 = pBVar22;
    pBStack_70 = unaff_RBX;
    uStack_68 = unaff_R12;
    pBStack_60 = unaff_R13;
    uStack_58 = unaff_R14;
    uStack_50 = unaff_R15;
    uStack_48 = unaff_RBP;
    do {
      if ((RALocalAllocator *)(ulong)*(uint *)((long)&(node->super_BaseNode).field_0 + 0xc) <=
          pRVar20) {
        puStack_a0 = (uint32_t *)0x11e495;
        spillAfterAllocation();
LAB_0011e495:
        puStack_a0 = (uint32_t *)0x11e49a;
        spillAfterAllocation();
LAB_0011e49a:
        puStack_a0 = (uint32_t *)0x11e49f;
        spillAfterAllocation();
LAB_0011e49f:
        puStack_a0 = (uint32_t *)0x11e4a4;
        spillAfterAllocation();
LAB_0011e4a4:
        puStack_a0 = (uint32_t *)0x11e4a9;
        spillAfterAllocation();
LAB_0011e4a9:
        puStack_a0 = (uint32_t *)allocBranch;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = (node->super_BaseNode).field_0.field_0._prev;
        pRStack_c8 = pRVar20;
        uStack_c0 = unaff_R12;
        pBStack_b8 = unaff_R13;
        pRStack_b0 = this;
        uStack_a8 = unaff_R15;
        puStack_a0 = puVar15;
        if (block->_entryPhysToWorkMap != (PhysToWorkMap *)0x0) {
          EVar12 = switchToAssignment(this_00,block->_entryPhysToWorkMap,block->_entryWorkToPhysMap,
                                      block->_liveBits,SUB41((block->_flags & 8) >> 3,0),true);
          pRVar20 = (RALocalAllocator *)(ulong)EVar12;
          if (EVar12 != 0) {
            return EVar12;
          }
        }
        EVar12 = allocInst(this_00,node);
        if (EVar12 != 0) {
          return EVar12;
        }
        uVar13 = block->_sharedAssignmentId;
        if ((ulong)uVar13 == 0xffffffff) {
          puVar15 = &block->_entryScratchGpRegs;
LAB_0011e564:
          EVar12 = spillScratchGpRegsBeforeEntry(this_00,*puVar15);
          if (EVar12 != 0) {
            return EVar12;
          }
          if (block->_entryPhysToWorkMap == (PhysToWorkMap *)0x0) {
            EVar12 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar12 != 0) {
              return EVar12;
            }
            goto LAB_0011e733;
          }
          pBVar22 = (this_00->_pass->_extraBlock->field_0).field_0._prev;
          unaff_R13 = BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,pBVar22);
          pWVar6 = (this_00->_curAssignment)._workToPhysMap;
          memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap,
                 (ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
          memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar6,
                 (ulong)(this_00->_tmpAssignment)._layout.workCount);
          bVar29 = false;
          EVar12 = switchToAssignment(this_00,block->_entryPhysToWorkMap,block->_entryWorkToPhysMap,
                                      block->_liveBits,SUB41((block->_flags & 8) >> 3,0),false);
          if (EVar12 != 0) goto LAB_0011e72e;
          EVar12 = (Error)pRVar20;
          if ((this_00->_cc->super_BaseBuilder)._cursor != pBVar22) {
            uVar13 = (node->super_BaseNode).field_1._any._reserved0 - 1;
            if ((node->super_BaseNode).field_1._any._reserved1 <= uVar13) goto LAB_0011e74b;
            if ((node->_opArray[uVar13]._signature & 7) != 4) goto LAB_0011e750;
            (*(this_00->_cc->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_f0);
            pOVar16 = node->_opArray + uVar13;
            uStack_e0._0_4_ = pOVar16->_signature;
            uStack_e0._4_4_ = pOVar16->_baseId;
            uStack_d8 = *(undefined8 *)node->_opArray[uVar13]._data;
            pOVar16->_signature = uStack_f0;
            node->_opArray[uVar13]._baseId = uStack_ec;
            node->_opArray[uVar13]._data[0] = uStack_e8;
            node->_opArray[uVar13]._data[1] = uStack_e4;
            puVar15 = &(node->_baseInst)._options;
            *(byte *)puVar15 = (byte)*puVar15 & 0xef;
            EVar12 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
            bVar29 = EVar12 == 0;
            if (bVar29) {
              pBVar7 = this_00->_cc;
              (pBVar7->super_BaseBuilder)._cursor = pBVar22;
              (*(pBVar7->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar7,&uStack_f0);
              EVar12 = (Error)pRVar20;
            }
            goto LAB_0011e6b3;
          }
        }
        else {
          if (uVar13 < (block->_ra->_sharedAssignments).super_ZoneVectorBase._size) {
            puVar15 = (uint32_t *)
                      ((ulong)uVar13 * 0x28 +
                      (long)(block->_ra->_sharedAssignments).super_ZoneVectorBase._data);
            goto LAB_0011e564;
          }
          allocBranch();
LAB_0011e74b:
          allocBranch();
LAB_0011e750:
          EVar12 = 3;
          bVar29 = false;
LAB_0011e6b3:
          if (!bVar29) {
            bVar29 = false;
            goto LAB_0011e72e;
          }
        }
        (this_00->_cc->super_BaseBuilder)._cursor = unaff_R13;
        pWVar6 = (this_00->_curAssignment)._workToPhysMap;
        pPVar8 = (this_00->_curAssignment)._physToWorkMap;
        pPVar9 = (this_00->_tmpAssignment)._physToWorkMap;
        (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
        (this_00->_curAssignment)._physToWorkMap = pPVar9;
        (this_00->_tmpAssignment)._workToPhysMap = pWVar6;
        (this_00->_tmpAssignment)._physToWorkMap = pPVar8;
        lVar17 = 0;
        do {
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds + lVar17;
          puVar15 = *ppuVar1;
          puVar10 = ppuVar1[1];
          ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds + lVar17;
          puVar11 = ppuVar2[1];
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds + lVar17;
          *ppuVar1 = *ppuVar2;
          ppuVar1[1] = puVar11;
          ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds + lVar17;
          *ppuVar1 = puVar15;
          ppuVar1[1] = puVar10;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 4);
        bVar29 = true;
LAB_0011e72e:
        if (bVar29) {
LAB_0011e733:
          EVar12 = 0;
        }
        return EVar12;
      }
      bVar29 = true;
      if ((*puVar15 & 0x20000) != 0) {
        uVar13 = puVar15[-1];
        unaff_R12 = (ulong)uVar13;
        if ((this->_pass->_workRegs).super_ZoneVectorBase._size <= uVar13) goto LAB_0011e495;
        lVar17 = *(long *)((long)(this->_pass->_workRegs).super_ZoneVectorBase._data + unaff_R12 * 8
                          );
        if (*(char *)(lVar17 + 0x3a) != -1) goto LAB_0011e465;
        if (uVar13 == 0xffffffff) goto LAB_0011e49a;
        if ((this->_curAssignment)._layout.workCount <= uVar13) goto LAB_0011e49f;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_R13 = (BaseNode *)(ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_0011e465;
        uVar28 = *(uint *)(lVar17 + 0x20);
        unaff_R15 = (ulong)uVar28;
        (this->_cc->super_BaseBuilder)._cursor = pBStack_78;
        if (0x1f < bVar3) goto LAB_0011e4a4;
        uVar28 = uVar28 >> 8 & 0xf;
        unaff_R15 = (ulong)uVar28;
        if (3 < uVar28) goto LAB_0011e4a9;
        if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks[unaff_R15] >> (bVar3 & 0x1f) &
            1) == 0) {
LAB_0011e436:
          puStack_a0 = (uint32_t *)0x11e449;
          RAAssignment::unassign(pRStack_90,uVar28,uVar13,(uint)bVar3);
          EVar12 = 0;
        }
        else {
          puStack_a0 = (uint32_t *)0x11e432;
          EVar12 = onSaveReg(this,uVar28,uVar13,(uint)bVar3);
          if (EVar12 == 0) goto LAB_0011e436;
        }
        bVar29 = EVar12 == 0;
        node = pIStack_80;
        this_00 = pRStack_88;
        if (!bVar29) {
          EStack_94 = EVar12;
        }
      }
LAB_0011e465:
      if (!bVar29) {
        return EStack_94;
      }
      pRVar20 = (RALocalAllocator *)((long)&pRVar20->_pass + 1);
      puVar15 = puVar15 + 6;
    } while (this_00 != pRVar20);
  }
  return 0;
}

Assistant:

uint32_t RALocalAllocator::decideOnReassignment(uint32_t group, uint32_t workId, uint32_t physId, uint32_t allocableRegs) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(group, physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer allocating back to HomeId, if possible.
  if (workReg->hasHomeRegId()) {
    if (Support::bitTest(allocableRegs, workReg->homeRegId()))
      return workReg->homeRegId();
  }

  // TODO: [Register Allocator] This could be improved.

  // Decided to SPILL.
  return RAAssignment::kPhysNone;
}